

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarLinux.cpp
# Opt level: O1

void tools::xar::close_non_std_fds(void)

{
  int __fd;
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *__s1;
  
  __fd = open("/proc/self/fd",0x10000);
  if ((-1 < __fd) && (__dirp = fdopendir(__fd), __dirp != (DIR *)0x0)) {
    pdVar2 = readdir(__dirp);
    while (pdVar2 != (dirent *)0x0) {
      __s1 = pdVar2->d_name;
      iVar1 = strcmp(__s1,".");
      if (((iVar1 != 0) && (iVar1 = strcmp(__s1,".."), iVar1 != 0)) &&
         (iVar1 = atoi(__s1), 2 < iVar1 && iVar1 != __fd)) {
        close(iVar1);
      }
      pdVar2 = readdir(__dirp);
    }
    closedir(__dirp);
    return;
  }
  return;
}

Assistant:

void tools::xar::close_non_std_fds() {
  auto dir_fd = open("/proc/self/fd", O_RDONLY | O_DIRECTORY);
  DIR* dir_handle = nullptr;
  if (dir_fd >= 0 && (dir_handle = fdopendir(dir_fd))) {
    for (auto dent = readdir(dir_handle); dent; dent = readdir(dir_handle)) {
      if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
        continue;
      }

      int fd = std::atoi(dent->d_name);
      if (fd != dir_fd && fd > 2) {
        close(fd);
      }
    }
    closedir(dir_handle);
  }
}